

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffDomain<0>::prune(AllDiffDomain<0> *this,int node,int i)

{
  int iVar1;
  bool *pbVar2;
  Node *pNVar3;
  IntVar *pIVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  Clause *pCVar16;
  Clause *c;
  Clause *local_38;
  
  pCVar16 = (Clause *)0x0;
  iVar6 = 0;
  if (so.lazy) {
    uVar5 = this->val_nodes[i].scc;
    uVar8 = (ulong)(int)uVar5;
    if ((long)uVar8 < 0) {
      uVar13 = 0x80000000;
      uVar12 = 0x7fffffff;
      iVar14 = 0;
    }
    else {
      iVar1 = this->sz;
      pbVar2 = this->scoreboard;
      pNVar3 = this->var_nodes;
      uVar13 = 0x80000000;
      uVar12 = 0x7fffffff;
      iVar14 = 0;
      iVar6 = 0;
      uVar10 = uVar5;
      do {
        uVar11 = uVar10 - iVar1;
        if ((int)uVar10 < iVar1) {
          iVar14 = iVar14 + 1;
        }
        else {
          iVar6 = iVar6 + 1;
          if ((int)uVar11 < (int)uVar12) {
            uVar12 = uVar11;
          }
          if ((int)uVar13 <= (int)uVar11) {
            uVar13 = uVar11;
          }
          pbVar2[(int)uVar11] = true;
        }
        uVar10 = pNVar3[uVar10].next;
      } while (-1 < (int)uVar10);
    }
    if (iVar6 == 1) {
      local_38 = (Clause *)malloc(0x10);
      *(uint *)local_38 = *(uint *)local_38 & 0xfc | 0x202;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar16 = local_38;
      if (this->sz <= (int)uVar5) {
        uVar5 = this->var_nodes[uVar8].next;
      }
      uVar5 = (*((this->x[(int)uVar5].var)->super_Var).super_Branching._vptr_Branching[10])();
      if (*(uint *)pCVar16 < 0x200) {
LAB_0015a7b5:
        abort();
      }
      *(uint *)(pCVar16 + 1) = uVar5;
    }
    else {
      iVar14 = iVar14 * ((uVar13 - (iVar6 + uVar12)) + 3);
      local_38 = (Clause *)malloc((long)iVar14 * 4 + 0xc);
      *(uint *)local_38 = (*(uint *)local_38 & 0xfc) + iVar14 * 0x100 + 0x102;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
      pCVar16 = local_38;
      if (-1 < (int)uVar5) {
        iVar6 = 1;
        do {
          uVar15 = uVar8 & 0xffffffff;
          if ((int)uVar8 < this->sz) {
            pIVar4 = this->x[uVar15].var;
            uVar5 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar4,(long)(int)uVar12,2);
            if ((int)(*(uint *)pCVar16 >> 8) <= iVar6) goto LAB_0015a7b5;
            iVar14 = iVar6 + 1;
            pCVar16->data[iVar6].x = uVar5 ^ 1;
            lVar9 = (long)(int)(uVar12 + 1);
            iVar6 = ~uVar12 + uVar13;
            if ((int)(uVar12 + 1) < (int)uVar13) {
              do {
                if (this->scoreboard[lVar9] == false) {
                  pIVar4 = this->x[uVar15].var;
                  uVar5 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])
                                    (pIVar4,lVar9,0);
                  if ((int)(*(uint *)pCVar16 >> 8) <= iVar14) goto LAB_0015a7b5;
                  lVar7 = (long)iVar14;
                  iVar14 = iVar14 + 1;
                  pCVar16->data[lVar7].x = uVar5 ^ 1;
                }
                lVar9 = lVar9 + 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
            }
            pIVar4 = this->x[uVar15].var;
            uVar5 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar4,(long)(int)uVar13,3);
            if ((int)(*(uint *)pCVar16 >> 8) <= iVar14) goto LAB_0015a7b5;
            iVar6 = iVar14 + 1;
            pCVar16->data[iVar14].x = uVar5 ^ 1;
          }
          uVar5 = this->var_nodes[uVar15].next;
          uVar8 = (ulong)uVar5;
        } while (-1 < (int)uVar5);
      }
    }
    memset(this->scoreboard + (int)uVar12,0,(long)(int)((uVar13 - uVar12) + 1));
  }
  pIVar4 = this->x[node].var;
  iVar6 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0x11])(pIVar4,(long)i,pCVar16,1);
  return SUB41(iVar6,0);
}

Assistant:

bool prune(int node, int i) {
		// fprintf(stderr, "prune var %d val %d\n", node, i);
		Clause* r = nullptr;
		if (so.lazy) {
			int vars = 0;
			int vals = 0;
			int min_val = INT_MAX;
			int max_val = INT_MIN;
			const int scc = val_nodes[i].scc;
			for (int j = scc; j >= 0; j = var_nodes[j].next) {
				if (j < sz) {
					++vars;
				} else {
					++vals;
					min_val = std::min(min_val, j - sz);
					max_val = std::max(max_val, j - sz);
					scoreboard[j - sz] = true;
				}
			}
			assert(vars == vals);
			if (vals == 1) {
				r = Reason_new(2);
				(*r)[1] = x[(scc < sz) ? scc : var_nodes[scc].next].getValLit();
			} else {
				r = Reason_new(1 + vars * (2 + (max_val + 1 - min_val) - vals));
				int k = 1;
				for (int j = scc; j >= 0; j = var_nodes[j].next) {
					if (j < sz) {
						(*r)[k++] = ~x[j].getLit(min_val, LR_GE);
						for (int v = min_val + 1; v < max_val; ++v) {
							if (!scoreboard[v]) {
								(*r)[k++] = ~x[j].getLit(v, LR_NE);
							}
						}
						(*r)[k++] = ~x[j].getLit(max_val, LR_LE);
					}
				}
				assert(k == 1 + vars * (2 + (max_val + 1 - min_val) - vals));
			}
			memset(scoreboard + min_val, 0, max_val + 1 - min_val);
		}
		return x[node].remVal(i, r);
	}